

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O0

void __thiscall Reset_removeReset_Test::Reset_removeReset_Test(Reset_removeReset_Test *this)

{
  Reset_removeReset_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Reset_removeReset_Test_00127078;
  return;
}

Assistant:

TEST(Reset, removeReset)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::ResetPtr r1 = libcellml::Reset::create();
    libcellml::ResetPtr r2 = libcellml::Reset::create();
    libcellml::ResetPtr r3 = libcellml::Reset::create();

    // Add r1 and r2 to c.
    EXPECT_TRUE(c->addReset(r1));
    EXPECT_TRUE(c->addReset(r2));
    EXPECT_EQ(size_t(2), c->resetCount());

    // Remove r1 from c.
    EXPECT_TRUE(c->removeReset(r1));
    EXPECT_EQ(nullptr, r1->parent());
    EXPECT_EQ(size_t(1), c->resetCount());

    // Remove r2 by index.
    EXPECT_TRUE(c->removeReset(0));
    EXPECT_EQ(size_t(0), c->resetCount());

    // Add r1, r2 and r3 to c, and use removeAllResets to remove them.
    EXPECT_TRUE(c->addReset(r1));
    EXPECT_TRUE(c->addReset(r2));
    EXPECT_TRUE(c->addReset(r3));
    EXPECT_EQ(size_t(3), c->resetCount());

    c->removeAllResets();
    EXPECT_EQ(size_t(0), c->resetCount());
}